

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat
          (DescriptorIndex *this,StringPiece name)

{
  StringPiece super_symbol;
  bool bVar1;
  bool bVar2;
  pointer pSVar3;
  const_reference this_00;
  Value VVar4;
  pair<const_void_*,_int> pVar5;
  string local_78;
  StringPiece local_58;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  local_48;
  SymbolCompare local_40;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  local_38;
  const_iterator iter;
  DescriptorIndex *this_local;
  StringPiece name_local;
  int local_10;
  
  name_local.ptr_ = (char *)name.length_;
  this_local = (DescriptorIndex *)name.ptr_;
  iter._M_current = (SymbolEntry *)this;
  local_40.index =
       (DescriptorIndex *)
       std::
       set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
       ::key_comp(&this->by_symbol_);
  local_38._M_current =
       (SymbolEntry *)
       (anonymous_namespace)::
       FindLastLessOrEqual<std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>,google::protobuf::stringpiece_internal::StringPiece,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                 (&this->by_symbol_flat_,(StringPiece *)&this_local,&local_40);
  local_48._M_current =
       (SymbolEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
       ::end(&this->by_symbol_flat_);
  bVar2 = __gnu_cxx::operator!=(&local_38,&local_48);
  bVar1 = false;
  if (bVar2) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
             ::operator->(&local_38);
    SymbolEntry::AsString_abi_cxx11_(&local_78,pSVar3,this);
    bVar1 = true;
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_58,&local_78);
    super_symbol.length_ = (size_type)name_local.ptr_;
    super_symbol.ptr_ = (char *)this_local;
    bVar2 = anon_unknown_31::IsSubSymbol(local_58,super_symbol);
    if (bVar2) {
      pSVar3 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
               ::operator->(&local_38);
      this_00 = std::
                vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                ::operator[](&this->all_values_,(long)pSVar3->data_offset);
      VVar4 = EncodedEntry::value(this_00);
      name_local.length_ = (size_type)VVar4.first;
      local_10 = VVar4.second;
      goto LAB_006c1b97;
    }
  }
  std::pair<const_void_*,_int>::pair<const_void_*,_int,_true>
            ((pair<const_void_*,_int> *)&name_local.length_);
LAB_006c1b97:
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  pVar5.second = local_10;
  pVar5.first = (void *)name_local.length_;
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat(
    StringPiece name) const {
  auto iter =
      FindLastLessOrEqual(&by_symbol_flat_, name, by_symbol_.key_comp());

  return iter != by_symbol_flat_.end() &&
                 IsSubSymbol(iter->AsString(*this), name)
             ? all_values_[iter->data_offset].value()
             : Value();
}